

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O0

DdNode * Bbr_NodeGlobalBdds_rec
                   (DdManager *dd,Aig_Obj_t *pNode,int nBddSizeMax,int fDropInternal,
                   ProgressBar *pProgress,int *pCounter,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  Aig_Obj_t *pAVar6;
  DdNode *n;
  DdNode *n_00;
  ulong uVar7;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFunc;
  int *pCounter_local;
  ProgressBar *pProgress_local;
  int fDropInternal_local;
  int nBddSizeMax_local;
  Aig_Obj_t *pNode_local;
  DdManager *dd_local;
  
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrNtbdd.c"
                  ,0x36,
                  "DdNode *Bbr_NodeGlobalBdds_rec(DdManager *, Aig_Obj_t *, int, int, ProgressBar *, int *, int)"
                 );
  }
  uVar2 = Cudd_ReadKeys(dd);
  uVar3 = Cudd_ReadDead(dd);
  if ((uint)nBddSizeMax < uVar2 - uVar3) {
    if (fVerbose != 0) {
      printf("The number of live nodes reached %d.\n",(ulong)(uint)nBddSizeMax);
    }
    fflush(_stdout);
    return (DdNode *)0x0;
  }
  pDVar5 = Aig_ObjGlobalBdd(pNode);
  if (pDVar5 == (DdNode *)0x0) {
    pAVar6 = Aig_ObjFanin0(pNode);
    pDVar5 = Bbr_NodeGlobalBdds_rec(dd,pAVar6,nBddSizeMax,fDropInternal,pProgress,pCounter,fVerbose)
    ;
    if (pDVar5 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(pDVar5);
    pAVar6 = Aig_ObjFanin1(pNode);
    n = Bbr_NodeGlobalBdds_rec(dd,pAVar6,nBddSizeMax,fDropInternal,pProgress,pCounter,fVerbose);
    if (n == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(n);
    iVar1 = Aig_ObjFaninC0(pNode);
    iVar4 = Aig_ObjFaninC1(pNode);
    n_00 = Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar5 ^ (long)iVar1),(DdNode *)((ulong)n ^ (long)iVar4)
                      );
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,(DdNode *)((ulong)pDVar5 ^ (long)iVar1));
    Cudd_RecursiveDeref(dd,(DdNode *)((ulong)n ^ (long)iVar4));
    *pCounter = *pCounter + 1;
    pDVar5 = Aig_ObjGlobalBdd(pNode);
    if (pDVar5 != (DdNode *)0x0) {
      __assert_fail("Aig_ObjGlobalBdd(pNode) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrNtbdd.c"
                    ,0x54,
                    "DdNode *Bbr_NodeGlobalBdds_rec(DdManager *, Aig_Obj_t *, int, int, ProgressBar *, int *, int)"
                   );
    }
    Aig_ObjSetGlobalBdd(pNode,n_00);
  }
  pDVar5 = Aig_ObjGlobalBdd(pNode);
  uVar7 = (ulong)(((uint)(*(ulong *)&pNode->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff;
  *(ulong *)&pNode->field_0x18 = *(ulong *)&pNode->field_0x18 & 0xffffffff0000003f | uVar7 << 6;
  if (((int)uVar7 == 0) && (fDropInternal != 0)) {
    Cudd_Deref(pDVar5);
    Aig_ObjSetGlobalBdd(pNode,(DdNode *)0x0);
  }
  return pDVar5;
}

Assistant:

DdNode * Bbr_NodeGlobalBdds_rec( DdManager * dd, Aig_Obj_t * pNode, int nBddSizeMax, int fDropInternal, ProgressBar * pProgress, int * pCounter, int fVerbose )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    assert( !Aig_IsComplement(pNode) );
    if ( Cudd_ReadKeys(dd)-Cudd_ReadDead(dd) > (unsigned)nBddSizeMax )
    {
//        Extra_ProgressBarStop( pProgress );
        if ( fVerbose )
        printf( "The number of live nodes reached %d.\n", nBddSizeMax );
        fflush( stdout );
        return NULL;
    }
    // if the result is available return
    if ( Aig_ObjGlobalBdd(pNode) == NULL )
    {
        // compute the result for both branches
        bFunc0 = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin0(pNode), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
        if ( bFunc0 == NULL )
            return NULL;
        Cudd_Ref( bFunc0 );
        bFunc1 = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin1(pNode), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
        if ( bFunc1 == NULL )
            return NULL;
        Cudd_Ref( bFunc1 );
        bFunc0 = Cudd_NotCond( bFunc0, Aig_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( bFunc1, Aig_ObjFaninC1(pNode) );
        // get the final result
        bFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( dd, bFunc0 );
        Cudd_RecursiveDeref( dd, bFunc1 );
        // add the number of used nodes
        (*pCounter)++;
        // set the result
        assert( Aig_ObjGlobalBdd(pNode) == NULL );
        Aig_ObjSetGlobalBdd( pNode, bFunc );
        // increment the progress bar
//        if ( pProgress )
//            Extra_ProgressBarUpdate( pProgress, *pCounter, NULL );
    }
    // prepare the return value
    bFunc = Aig_ObjGlobalBdd(pNode);
    // dereference BDD at the node
    if ( --pNode->nRefs == 0 && fDropInternal )
    {
        Cudd_Deref( bFunc );
        Aig_ObjSetGlobalBdd( pNode, NULL );
    }
    return bFunc;
}